

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O3

void Dch_ClassesCollectConst1Group(Dch_Cla_t *p,Aig_Obj_t *pObj,int nNodes,Vec_Ptr_t *vRoots)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  void **ppvVar6;
  Aig_Obj_t *pAVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  
  vRoots->nSize = 0;
  uVar10 = pObj->Id;
  uVar1 = p->pAig->vObjs->nSize;
  uVar8 = nNodes + uVar10;
  if ((int)uVar1 <= (int)(nNodes + uVar10)) {
    uVar8 = uVar1;
  }
  if ((int)uVar10 < (int)uVar8) {
    iVar9 = 0;
    do {
      pAVar3 = p->pAig;
      pVVar4 = pAVar3->vObjs;
      if (pVVar4 != (Vec_Ptr_t *)0x0) {
        if (((int)uVar10 < 0) || (pVVar4->nSize <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar5 = pVVar4->pArray[uVar10];
        if (pvVar5 != (void *)0x0) {
          if (pAVar3->pReprs == (Aig_Obj_t **)0x0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = pAVar3->pReprs[*(int *)((long)pvVar5 + 0x24)];
          }
          if (pAVar7 == pAVar3->pConst1) {
            if (iVar9 == vRoots->nCap) {
              if (iVar9 < 0x10) {
                if (vRoots->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(vRoots->pArray,0x80);
                }
                vRoots->pArray = ppvVar6;
                vRoots->nCap = 0x10;
              }
              else {
                __size = (ulong)(uint)(iVar9 * 2) * 8;
                if (vRoots->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(__size);
                }
                else {
                  ppvVar6 = (void **)realloc(vRoots->pArray,__size);
                }
                vRoots->pArray = ppvVar6;
                vRoots->nCap = iVar9 * 2;
              }
            }
            else {
              ppvVar6 = vRoots->pArray;
            }
            iVar2 = vRoots->nSize;
            iVar9 = iVar2 + 1;
            vRoots->nSize = iVar9;
            ppvVar6[iVar2] = pvVar5;
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  return;
}

Assistant:

void Dch_ClassesCollectConst1Group( Dch_Cla_t * p, Aig_Obj_t * pObj, int nNodes, Vec_Ptr_t * vRoots )
{
    int i, Limit;
    Vec_PtrClear( vRoots );
    Limit = Abc_MinInt( pObj->Id + nNodes, Aig_ManObjNumMax(p->pAig) );
    for ( i = pObj->Id; i < Limit; i++ )
    {
        pObj = Aig_ManObj( p->pAig, i );
        if ( pObj && Dch_ObjIsConst1Cand( p->pAig, pObj ) )
            Vec_PtrPush( vRoots, pObj );
    }
}